

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

bool QTestResult::reportResult
               (bool success,void *lhs,void *rhs,_func_char_ptr_void_ptr *lhsFormatter,
               _func_char_ptr_void_ptr *rhsFormatter,char *lhsExpr,char *rhsExpr,
               ComparisonOperation op,char *file,int line,char *failureMessage)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *val1;
  char *val2;
  undefined8 extraout_RAX;
  void *unaff_R12;
  void *unaff_R13;
  long in_FS_OFFSET;
  char msg [4096];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg[0] = '\0';
  if (lhsExpr == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0013e37d;
    reportResult();
  }
  else if (rhsExpr != (char *)0x0) {
    iVar3 = QTestLog::verboseLevel();
    if (1 < iVar3) {
      snprintf(msg,0x1000,"%s(%s, %s)",(&PTR_anon_var_dwarf_10a52d_0016f8b0)[(int)op],lhsExpr,
               rhsExpr);
      QTestLog::info(msg,file,line);
    }
    if (success) {
      if (QTest::expectFailMode != 0) {
        snprintf(msg,0x1000,"%s(%s, %s) returned TRUE unexpectedly.",
                 (&PTR_anon_var_dwarf_10a52d_0016f8b0)[(int)op],lhsExpr,rhsExpr);
      }
      bVar2 = checkStatement(true,msg,file,line);
    }
    else {
      val1 = (*lhsFormatter)(lhs);
      val2 = (*rhsFormatter)(rhs);
      if (failureMessage == (char *)0x0) {
        failureMessage = &DAT_00159614 + *(int *)(&DAT_00159614 + (long)(int)op * 4);
      }
      formatFailMessage(msg,0x1000,failureMessage,val1,val2,lhsExpr,rhsExpr,op);
      bVar2 = checkStatement(false,msg,file,line);
      if (val2 != (char *)0x0) {
        operator_delete__(val2);
      }
      if (val1 != (char *)0x0) {
        operator_delete__(val1);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return bVar2;
    }
    goto LAB_0013e37d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    reportResult();
    if (unaff_R13 != (void *)0x0) {
      operator_delete__(unaff_R13);
    }
    if (unaff_R12 != (void *)0x0) {
      operator_delete__(unaff_R12);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      _Unwind_Resume(extraout_RAX);
    }
  }
LAB_0013e37d:
  __stack_chk_fail();
}

Assistant:

bool QTestResult::reportResult(bool success, const void *lhs, const void *rhs,
                               const char *(*lhsFormatter)(const void*),
                               const char *(*rhsFormatter)(const void*),
                               const char *lhsExpr, const char *rhsExpr,
                               QTest::ComparisonOperation op, const char *file, int line,
                               const char *failureMessage)
{
    Q_DECL_UNINITIALIZED char msg[maxMsgLen];
    msg[0] = '\0';

    QTEST_ASSERT(lhsExpr);
    QTEST_ASSERT(rhsExpr);

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "%s(%s, %s)", macroNameForOp(op), lhsExpr, rhsExpr);
        QTestLog::info(msg, file, line);
    }

    if (success) {
        if (QTest::expectFailMode) {
            std::snprintf(msg, maxMsgLen, "%s(%s, %s) returned TRUE unexpectedly.",
                          macroNameForOp(op), lhsExpr, rhsExpr);
        }
        return checkStatement(success, msg, file, line);
    }

    const std::unique_ptr<const char[]> lhsPtr{ lhsFormatter(lhs) };
    const std::unique_ptr<const char[]> rhsPtr{ rhsFormatter(rhs) };

    if (!failureMessage)
        failureMessage = failureMessageForOp(op);

    formatFailMessage(msg, maxMsgLen, failureMessage, lhsPtr.get(), rhsPtr.get(),
                      lhsExpr, rhsExpr, op);

    return checkStatement(success, msg, file, line);
}